

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O2

void __thiscall E64::blitter_ic::terminal_cursor_decrease(blitter_ic *this,uint8_t no)

{
  ushort uVar1;
  undefined2 uVar2;
  blit_t *pbVar3;
  ulong uVar4;
  ushort uVar5;
  undefined7 in_register_00000031;
  
  pbVar3 = this->blit;
  uVar4 = CONCAT71(in_register_00000031,no) & 0xffffffff;
  uVar2 = pbVar3[uVar4].cursor_position;
  uVar5 = uVar2 - 1;
  pbVar3[uVar4].cursor_position = uVar5;
  uVar1 = pbVar3[uVar4].tiles;
  if (uVar1 <= uVar5) {
    pbVar3[uVar4].cursor_position = uVar1 - 1;
  }
  pbVar3[uVar4].cursor_big_move = uVar1 <= uVar5;
  return;
}

Assistant:

void E64::blitter_ic::terminal_cursor_decrease(uint8_t no)
{
	blit[no].cursor_position--;
	if (blit[no].cursor_position > blit[no].get_tiles() - 1) {
		blit[no].cursor_position = blit[no].get_tiles() - 1;
		blit[no].cursor_big_move = true;
	} else {
		blit[no].cursor_big_move = false;
	}
}